

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  curl_mimepart *part;
  uint *puVar1;
  undefined4 *puVar2;
  curl_slist *pcVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  curl_off_t cVar7;
  _Bool *p_Var8;
  char *fmt;
  char *pcVar9;
  Curl_easy *pCVar10;
  char *local_38;
  
  *done = false;
  pCVar10 = conn->data;
  pcVar9 = (pCVar10->set).str[6];
  if (pcVar9 != (char *)0x0) {
    CVar4 = Curl_urldecode(pCVar10,pcVar9,0,(char **)((long)(pCVar10->req).protop + 8),(size_t *)0x0
                           ,true);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pCVar10 = conn->data;
  }
  (pCVar10->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar10,0);
  Curl_pgrsSetDownloadCounter(pCVar10,0);
  Curl_pgrsSetUploadSize(pCVar10,-1);
  Curl_pgrsSetDownloadSize(pCVar10,-1);
  pCVar10 = conn->data;
  puVar2 = (undefined4 *)(pCVar10->req).protop;
  if ((pCVar10->set).opt_no_body == true) {
    *puVar2 = 1;
  }
  *done = false;
  pcVar3 = (pCVar10->set).mail_rcpt;
  *(curl_slist **)(puVar2 + 4) = pcVar3;
  *(undefined1 *)(puVar2 + 8) = 1;
  *(undefined8 *)(puVar2 + 6) = 2;
  if ((pCVar10->set).upload == false) {
    if (pcVar3 == (curl_slist *)0x0 || (pCVar10->set).mimepost.kind == MIMEKIND_NONE)
    goto LAB_00132b43;
  }
  else if (pcVar3 == (curl_slist *)0x0) {
LAB_00132b43:
    CVar4 = smtp_perform_command(conn);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    goto LAB_00132d54;
  }
  pcVar9 = (pCVar10->set).str[0x37];
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (*Curl_cstrdup)("<>");
  }
  else {
    if (*pcVar9 == '<') {
      pcVar9 = "%s";
    }
    else {
      pcVar9 = "<%s>";
    }
    pcVar9 = curl_maprintf(pcVar9);
  }
  if (pcVar9 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar5 = (pCVar10->set).str[0x38];
  if ((pcVar5 == (char *)0x0) || ((conn->proto).ftpc.cwdcount == 0)) {
    pcVar5 = (char *)0x0;
  }
  else {
    if (*pcVar5 == '\0') {
      pcVar5 = (*Curl_cstrdup)("<>");
    }
    else {
      pcVar5 = curl_maprintf("%s");
    }
    if (pcVar5 == (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((pCVar10->set).mimepost.kind != MIMEKIND_NONE) {
    part = &(pCVar10->set).mimepost;
    puVar1 = &(pCVar10->set).mimepost.flags;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
    curl_mime_headers(part,(pCVar10->set).headers,0);
    CVar4 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
    if ((CVar4 != CURLE_OK) ||
       (((pcVar6 = Curl_checkheaders(conn,"Mime-Version"), pcVar6 == (char *)0x0 &&
         (CVar4 = Curl_mime_add_header(&(pCVar10->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar4 != CURLE_OK)) || (CVar4 = Curl_mime_rewind(part), CVar4 != CURLE_OK)))) {
      (*Curl_cfree)(pcVar9);
      goto LAB_00132db8;
    }
    cVar7 = Curl_mime_size(part);
    (pCVar10->state).infilesize = cVar7;
    (pCVar10->state).fread_func = Curl_mime_read;
    (pCVar10->state).in = part;
  }
  pp = &conn->proto;
  if (((conn->proto).imapc.resptag[1] == '\x01') && (0 < (pCVar10->state).infilesize)) {
    local_38 = curl_maprintf("%ld");
    if (local_38 == (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      CVar4 = CURLE_OUT_OF_MEMORY;
LAB_00132db8:
      (*Curl_cfree)(pcVar5);
      return CVar4;
    }
    if (pcVar5 == (char *)0x0) {
      fmt = "MAIL FROM:%s SIZE=%s";
      pcVar6 = local_38;
      goto LAB_00132cf1;
    }
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s AUTH=%s SIZE=%s",pcVar9,pcVar5,local_38);
  }
  else if (pcVar5 == (char *)0x0) {
    local_38 = (char *)0x0;
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s",pcVar9);
  }
  else {
    fmt = "MAIL FROM:%s AUTH=%s";
    local_38 = (char *)0x0;
    pcVar6 = pcVar5;
LAB_00132cf1:
    CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,fmt,pcVar9,pcVar6);
  }
  (*Curl_cfree)(pcVar9);
  (*Curl_cfree)(pcVar5);
  (*Curl_cfree)(local_38);
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  (conn->proto).imapc.state = IMAP_SELECT;
LAB_00132d54:
  p_Var8 = done;
  CVar4 = smtp_multi_statemach(conn,done);
  if ((CVar4 == CURLE_OK) && (CVar4 = CURLE_OK, *done == true)) {
    smtp_dophase_done(conn,SUB81(p_Var8,0));
  }
  return CVar4;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}